

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O2

void __thiscall Lodtalk::SpecialRuntimeObjects::~SpecialRuntimeObjects(SpecialRuntimeObjects *this)

{
  std::_Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>::
  ~_Vector_base(&(this->specialClassTable).
                 super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
               );
  std::_Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::~_Vector_base
            ((_Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_> *)this);
  return;
}

Assistant:

SpecialRuntimeObjects::~SpecialRuntimeObjects()
{
}